

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

int testing::internal::ExecDeathTestChildMain(void *child_arg)

{
  char **__argv;
  char *__path;
  int iVar1;
  int *piVar2;
  UnitTest *this;
  char **__envp;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  allocator local_2b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  allocator local_1d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  char *local_150;
  char *original_dir;
  string local_140;
  allocator local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_24;
  undefined8 *puStack_20;
  int gtest_retval;
  ExecDeathTestArgs *args;
  void *child_arg_local;
  
  puStack_20 = (undefined8 *)child_arg;
  args = (ExecDeathTestArgs *)child_arg;
  do {
    do {
      local_24 = close(*(int *)(puStack_20 + 1));
      bVar3 = false;
      if (local_24 == -1) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
    if (local_24 == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_108,"CHECK failed: File ",&local_109);
      std::operator+(&local_e8,&local_108,
                     "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/googletest/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_c8,&local_e8,", line ");
      original_dir._4_4_ = 0x3c2;
      StreamableToString<int>(&local_140,(int *)((long)&original_dir + 4));
      std::operator+(&local_a8,&local_c8,&local_140);
      std::operator+(&local_88,&local_a8,": ");
      std::operator+(&local_68,&local_88,"close(args->close_fd)");
      std::operator+(&local_48,&local_68," != -1");
      DeathTestAbort(&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
    }
    bVar3 = AlwaysFalse();
  } while (bVar3);
  this = UnitTest::GetInstance();
  local_150 = UnitTest::original_working_dir(this);
  iVar1 = chdir(local_150);
  if (iVar1 == 0) {
    __argv = (char **)*puStack_20;
    __path = *__argv;
    __envp = GetEnviron();
    execve(__path,__argv,__envp);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2b8,"execve(",&local_2b9);
    std::operator+(&local_298,&local_2b8,*(char **)*puStack_20);
    std::operator+(&local_278,&local_298,", ...) in ");
    std::operator+(&local_258,&local_278,local_150);
    std::operator+(&local_238,&local_258," failed: ");
    GetLastErrnoDescription_abi_cxx11_();
    std::operator+(&local_218,&local_238,&local_2e0);
    DeathTestAbort(&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1d0,"chdir(\"",&local_1d1);
    std::operator+(&local_1b0,&local_1d0,local_150);
    std::operator+(&local_190,&local_1b0,"\") failed: ");
    GetLastErrnoDescription_abi_cxx11_();
    std::operator+(&local_170,&local_190,&local_1f8);
    DeathTestAbort(&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  }
  return 1;
}

Assistant:

static int ExecDeathTestChildMain(void* child_arg) {
  ExecDeathTestArgs* const args = static_cast<ExecDeathTestArgs*>(child_arg);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(args->close_fd));

  // We need to execute the test program in the same environment where
  // it was originally invoked.  Therefore we change to the original
  // working directory first.
  const char* const original_dir =
      UnitTest::GetInstance()->original_working_dir();
  // We can safely call chdir() as it's a direct system call.
  if (chdir(original_dir) != 0) {
    DeathTestAbort(std::string("chdir(\"") + original_dir + "\") failed: " +
                   GetLastErrnoDescription());
    return EXIT_FAILURE;
  }

  // We can safely call execve() as it's a direct system call.  We
  // cannot use execvp() as it's a libc function and thus potentially
  // unsafe.  Since execve() doesn't search the PATH, the user must
  // invoke the test program via a valid path that contains at least
  // one path separator.
  execve(args->argv[0], args->argv, GetEnviron());
  DeathTestAbort(std::string("execve(") + args->argv[0] + ", ...) in " +
                 original_dir + " failed: " +
                 GetLastErrnoDescription());
  return EXIT_FAILURE;
}